

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O3

void __thiscall DOMTest::findTestNodes(DOMTest *this,DOMDocument *document)

{
  DOMElement *pDVar1;
  DOMElement *pDVar2;
  DOMElement *pDVar3;
  DOMElement *pDVar4;
  DOMElement *pDVar5;
  DOMElement *pDVar6;
  DOMElement *pDVar7;
  DOMElement *pDVar8;
  DOMElement *pDVar9;
  DOMDocument *pDVar10;
  DOMElement *pDVar11;
  DOMElement *pDVar12;
  DOMElement *pDVar13;
  DOMElement *pDVar14;
  undefined4 uVar15;
  int iVar16;
  
  if (document != (DOMDocument *)0x0) {
    pDVar1 = (DOMElement *)(document + 0x18);
    iVar16 = 0;
    do {
      uVar15 = (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1);
      pDVar2 = testElementNode;
      pDVar3 = (DOMElement *)testAttributeNode;
      pDVar4 = (DOMElement *)testTextNode;
      pDVar5 = (DOMElement *)testCDATASectionNode;
      pDVar6 = (DOMElement *)testEntityReferenceNode;
      pDVar7 = (DOMElement *)testEntityNode;
      pDVar8 = (DOMElement *)testProcessingInstructionNode;
      pDVar9 = (DOMElement *)testCommentNode;
      pDVar10 = testDocumentNode;
      pDVar11 = (DOMElement *)testDocumentTypeNode;
      pDVar12 = (DOMElement *)testNotationNode;
      pDVar13 = (DOMElement *)testDocumentFragmentNode;
      switch(uVar15) {
      case 1:
        pDVar2 = pDVar1;
        pDVar14 = testElementNode;
        break;
      case 2:
        pDVar3 = pDVar1;
        pDVar14 = (DOMElement *)testAttributeNode;
        break;
      case 3:
        pDVar4 = pDVar1;
        pDVar14 = (DOMElement *)testTextNode;
        break;
      case 4:
        pDVar5 = pDVar1;
        pDVar14 = (DOMElement *)testCDATASectionNode;
        break;
      case 5:
        pDVar6 = pDVar1;
        pDVar14 = (DOMElement *)testEntityReferenceNode;
        break;
      case 6:
        pDVar7 = pDVar1;
        pDVar14 = (DOMElement *)testEntityNode;
        break;
      case 7:
        pDVar8 = pDVar1;
        pDVar14 = (DOMElement *)testProcessingInstructionNode;
        break;
      case 8:
        pDVar9 = pDVar1;
        pDVar14 = (DOMElement *)testCommentNode;
        break;
      case 9:
        pDVar10 = document;
        pDVar14 = (DOMElement *)testDocumentNode;
        break;
      case 10:
        pDVar11 = pDVar1;
        pDVar14 = (DOMElement *)testDocumentTypeNode;
        break;
      case 0xb:
        pDVar13 = pDVar1;
        pDVar14 = (DOMElement *)testDocumentFragmentNode;
        break;
      case 0xc:
        pDVar12 = pDVar1;
        pDVar14 = (DOMElement *)testNotationNode;
        break;
      default:
        goto switchD_0010f025_default;
      }
      if (pDVar14 == (DOMElement *)0x0) {
        iVar16 = iVar16 + 1;
        testElementNode = pDVar2;
        testAttributeNode = (DOMAttr *)pDVar3;
        testTextNode = (DOMText *)pDVar4;
        testCDATASectionNode = (DOMCDATASection *)pDVar5;
        testEntityReferenceNode = (DOMEntityReference *)pDVar6;
        testEntityNode = (DOMEntity *)pDVar7;
        testProcessingInstructionNode = (DOMProcessingInstruction *)pDVar8;
        testCommentNode = (DOMComment *)pDVar9;
        testDocumentNode = pDVar10;
        testDocumentTypeNode = (DOMDocumentType *)pDVar11;
        testDocumentFragmentNode = (DOMDocumentFragment *)pDVar13;
        testNotationNode = (DOMNotation *)pDVar12;
      }
switchD_0010f025_default:
    } while (iVar16 < 0xc);
  }
  return;
}

Assistant:

void DOMTest::findTestNodes(DOMDocument* document) {
    DOMNode* node = document;
    int nodeCount = 0;

    // Walk the tree until you find and assign all node types needed that exist.
    while (node != 0 && nodeCount < 12)
    {

        switch (node->getNodeType())
    {
        case DOMNode::ELEMENT_NODE :
            if (testElementNode == 0) {testElementNode = (DOMElement*)node; nodeCount++;}
            break;
        case DOMNode::ATTRIBUTE_NODE :
            if (testAttributeNode == 0) {testAttributeNode = (DOMAttr*)node; nodeCount++;}
            break;
        case DOMNode::TEXT_NODE :
            if (testTextNode == 0) {testTextNode = (DOMText*)node; nodeCount++;}
            break;
        case DOMNode::CDATA_SECTION_NODE :
            if (testCDATASectionNode == 0) {testCDATASectionNode = (DOMCDATASection*)node; nodeCount++;}
            break;
        case DOMNode::ENTITY_REFERENCE_NODE :
            if (testEntityReferenceNode == 0) {testEntityReferenceNode = (DOMEntityReference*)node; nodeCount++;}
            break;
        case DOMNode::ENTITY_NODE :
            if (testEntityNode == 0) {testEntityNode = (DOMEntity*)node; nodeCount++;}
            break;
        case DOMNode::PROCESSING_INSTRUCTION_NODE :
            if (testProcessingInstructionNode == 0) {testProcessingInstructionNode = (DOMProcessingInstruction*)node; nodeCount++;}
            break;
        case DOMNode::COMMENT_NODE :
            if (testCommentNode == 0) {testCommentNode = (DOMComment*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_TYPE_NODE :
            if (testDocumentTypeNode == 0) {testDocumentTypeNode = (DOMDocumentType*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_FRAGMENT_NODE :
            if (testDocumentFragmentNode == 0) {testDocumentFragmentNode = (DOMDocumentFragment*)node; nodeCount++;}
            break;
        case DOMNode::NOTATION_NODE :
            if (testNotationNode == 0) {testNotationNode = (DOMNotation*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_NODE :
            if (testDocumentNode == 0) {testDocumentNode = (DOMDocument*)node; nodeCount++;}
            break;
        default:
            ;
    }// End of switch

    }   // End of while
}